

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

void llvm::cl::ParseEnvironmentOptions(char *progName,char *envVar,char *Overview)

{
  void *pvVar1;
  undefined8 uVar2;
  char *pcVar3;
  size_t sVar4;
  size_t in_RCX;
  undefined1 in_R9B;
  undefined7 in_register_00000089;
  StringRef SVar5;
  StringRef S;
  StringRef Src;
  StringRef Overview_00;
  StringSaver Saver;
  Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  envValue;
  BumpPtrAllocator A;
  SmallVector<const_char_*,_20U> newArgv;
  StringSaver local_180;
  cl *local_178;
  char *local_170;
  long local_168 [2];
  bool local_158;
  char *local_150;
  BumpPtrAllocator local_148;
  SmallVectorTemplateBase<const_char_*,_true> local_d8;
  BumpPtrAllocator local_c8;
  
  if (progName == (char *)0x0) {
    __assert_fail("progName && \"Program name not specified\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/CommandLine.cpp"
                  ,0x40d,
                  "void llvm::cl::ParseEnvironmentOptions(const char *, const char *, const char *)"
                 );
  }
  if (envVar == (char *)0x0) {
    __assert_fail("envVar && \"Environment variable name missing\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/CommandLine.cpp"
                  ,0x40e,
                  "void llvm::cl::ParseEnvironmentOptions(const char *, const char *, const char *)"
                 );
  }
  pcVar3 = (char *)strlen(envVar);
  SVar5.Length = in_RCX;
  SVar5.Data = pcVar3;
  sys::Process::GetEnv_abi_cxx11_
            ((Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_178,(Process *)envVar,SVar5);
  if (local_158 == true) {
    local_d8.super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase.Size = 0;
    local_d8.super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase.Capacity =
         0x14;
    local_148.Slabs.super_SmallVectorImpl<void_*>.super_SmallVectorTemplateBase<void_*,_true>.
    super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.BeginX =
         &local_148.Slabs.super_SmallVectorStorage<void_*,_4U>;
    local_148.CurPtr = (char *)0x0;
    local_148.End = (char *)0x0;
    local_148.Slabs.super_SmallVectorImpl<void_*>.super_SmallVectorTemplateBase<void_*,_true>.
    super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.Size = 0;
    local_148.Slabs.super_SmallVectorImpl<void_*>.super_SmallVectorTemplateBase<void_*,_true>.
    super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.Capacity = 4;
    local_148.CustomSizedSlabs.super_SmallVectorImpl<std::pair<void_*,_unsigned_long>_>.
    super_SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_true>.
    super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>.super_SmallVectorBase.
    BeginX = &local_148.BytesAllocated;
    local_148.CustomSizedSlabs.super_SmallVectorImpl<std::pair<void_*,_unsigned_long>_>.
    super_SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_true>.
    super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>.super_SmallVectorBase.
    Size = 0;
    local_148.CustomSizedSlabs.super_SmallVectorImpl<std::pair<void_*,_unsigned_long>_>.
    super_SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_true>.
    super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>.super_SmallVectorBase.
    Capacity = 0;
    local_148.BytesAllocated = 0;
    local_148.RedZoneSize = 1;
    local_180.Alloc = &local_148;
    local_d8.super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase.BeginX =
         &local_c8;
    sVar4 = strlen(progName);
    S.Length = sVar4;
    S.Data = progName;
    SVar5 = StringSaver::save(&local_180,S);
    local_150 = SVar5.Data;
    SmallVectorTemplateBase<const_char_*,_true>::push_back(&local_d8,&local_150);
    if (local_158 == false) {
      __assert_fail("Storage.hasVal",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/Optional.h"
                    ,0xb0,
                    "T *llvm::Optional<std::basic_string<char>>::getPointer() [T = std::basic_string<char>]"
                   );
    }
    Src.Length = (size_t)&local_180;
    Src.Data = local_170;
    TokenizeGNUCommandLine
              (local_178,Src,(StringSaver *)&local_d8,(SmallVectorImpl<const_char_*> *)0x0,
               (bool)in_R9B);
    uVar2 = local_d8.super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase._8_8_
    ;
    pvVar1 = local_d8.super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase.
             BeginX;
    if (local_d8.super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase.Size == 0
       ) {
      __assert_fail("idx < size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x9b,
                    "reference llvm::SmallVectorTemplateCommon<const char *>::operator[](size_type) [T = const char *]"
                   );
    }
    if (Overview == (char *)0x0) {
      sVar4 = 0;
    }
    else {
      sVar4 = strlen(Overview);
    }
    Overview_00.Length = 0;
    Overview_00.Data = (char *)sVar4;
    ParseCommandLineOptions
              ((cl *)(uVar2 & 0xffffffff),(int)pvVar1,(char **)Overview,Overview_00,
               (raw_ostream *)CONCAT71(in_register_00000089,in_R9B));
    BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::~BumpPtrAllocatorImpl(&local_148);
    if ((BumpPtrAllocator *)
        local_d8.super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase.BeginX !=
        &local_c8) {
      free(local_d8.super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase.BeginX
          );
    }
  }
  if ((local_158 == true) && (local_178 != (cl *)local_168)) {
    operator_delete(local_178,local_168[0] + 1);
  }
  return;
}

Assistant:

void cl::ParseEnvironmentOptions(const char *progName, const char *envVar,
                                 const char *Overview) {
  // Check args.
  assert(progName && "Program name not specified");
  assert(envVar && "Environment variable name missing");

  // Get the environment variable they want us to parse options out of.
  llvm::Optional<std::string> envValue = sys::Process::GetEnv(StringRef(envVar));
  if (!envValue)
    return;

  // Get program's "name", which we wouldn't know without the caller
  // telling us.
  SmallVector<const char *, 20> newArgv;
  BumpPtrAllocator A;
  StringSaver Saver(A);
  newArgv.push_back(Saver.save(progName).data());

  // Parse the value of the environment variable into a "command line"
  // and hand it off to ParseCommandLineOptions().
  TokenizeGNUCommandLine(*envValue, Saver, newArgv);
  int newArgc = static_cast<int>(newArgv.size());
  ParseCommandLineOptions(newArgc, &newArgv[0], StringRef(Overview));
}